

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

void roundup_tmp_buffer(FFSBuffer buf,int req_alignment)

{
  uint uVar1;
  void *pvVar2;
  int in_ESI;
  long *in_RDI;
  int pad;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = in_ESI - (int)in_RDI[1] & in_ESI - 1U;
  if (uVar1 != 0) {
    pvVar2 = ffs_realloc((void *)CONCAT44(in_ESI,uVar1),CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    *in_RDI = (long)pvVar2;
    memset((void *)(*in_RDI + in_RDI[1]),0,(long)(int)uVar1);
    in_RDI[1] = (long)(int)uVar1 + in_RDI[1];
  }
  return;
}

Assistant:

void
roundup_tmp_buffer(FFSBuffer buf, int req_alignment)
{
    int pad = (req_alignment - buf->tmp_buffer_size) & (req_alignment -1);  /*  only works if req_align is power of two */
    switch (req_alignment) {
    case 1: case 2: case 4: case 8: case 16: break;
    default:
	assert(0);
    }
    if (pad) {
	buf->tmp_buffer = realloc(buf->tmp_buffer, buf->tmp_buffer_size + pad);
	memset((char*)buf->tmp_buffer + buf->tmp_buffer_size, 0, pad);
	buf->tmp_buffer_size += pad;
    }
}